

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

char * gl4cts::anon_unknown_0::GetInputOp1
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  DataType *pDVar1;
  pointer puVar2;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x90);
  pDVar1 = (DataType *)
           (in_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1[0] = TYPE_FLOAT;
  pDVar1[1] = TYPE_FLOAT_VEC2;
  pDVar1[2] = TYPE_FLOAT_VEC3;
  pDVar1[3] = TYPE_FLOAT_VEC4;
  pDVar1[4] = 0x3f800000;
  pDVar1[5] = 0x40000000;
  pDVar1[6] = 0x40400000;
  pDVar1[7] = TYPE_INVALID;
  pDVar1[8] = TYPE_FLOAT;
  pDVar1[9] = TYPE_FLOAT_VEC2;
  pDVar1[10] = TYPE_FLOAT_VEC3;
  pDVar1[0xb] = TYPE_FLOAT_VEC4;
  pDVar1[0xc] = TYPE_FLOAT;
  pDVar1[0xd] = ~TYPE_FLOAT;
  pDVar1[0xe] = TYPE_FLOAT_VEC3;
  pDVar1[0xf] = TYPE_FLOAT_VEC4;
  pDVar1[0x10] = 0x3f800000;
  pDVar1[0x11] = 0x40000000;
  pDVar1[0x12] = 0x40400000;
  pDVar1[0x13] = 0x40800000;
  pDVar1[0x14] = 0x3f800000;
  pDVar1[0x15] = 0x40000000;
  pDVar1[0x16] = 0x40400000;
  pDVar1[0x17] = 0x40800000;
  pDVar1[0x18] = 0x3f800000;
  pDVar1[0x19] = 0x40000000;
  pDVar1[0x1a] = 0x40400000;
  pDVar1[0x1b] = 0x40800000;
  pDVar1[0x1c] = 0x3f800000;
  pDVar1[0x1d] = 0x40000000;
  pDVar1[0x1e] = 0x40400000;
  pDVar1[0x1f] = 0x40800000;
  pDVar1[0x20] = 0x3f800000;
  pDVar1[0x21] = TYPE_INVALID;
  pDVar1[0x22] = TYPE_INVALID;
  pDVar1[0x23] = 0x40800000;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out_data,0x90);
  puVar2 = (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2[0] = '\x04';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\x03';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  puVar2[8] = '\x02';
  puVar2[9] = '\0';
  puVar2[10] = '\0';
  puVar2[0xb] = '\0';
  puVar2[0xc] = '\x01';
  puVar2[0xd] = '\0';
  puVar2[0xe] = '\0';
  puVar2[0xf] = '\0';
  puVar2[0x10] = '\0';
  puVar2[0x11] = '\0';
  puVar2[0x12] = '@';
  puVar2[0x13] = '@';
  puVar2[0x14] = '\0';
  puVar2[0x15] = '\0';
  puVar2[0x16] = '\0';
  puVar2[0x17] = '@';
  puVar2[0x18] = '\0';
  puVar2[0x19] = '\0';
  puVar2[0x1a] = 0x80;
  puVar2[0x1b] = '?';
  puVar2[0x1c] = '\0';
  puVar2[0x1d] = '\0';
  puVar2[0x1e] = '\0';
  puVar2[0x1f] = '\0';
  puVar2[0x20] = '\x04';
  puVar2[0x21] = '\0';
  puVar2[0x22] = '\0';
  puVar2[0x23] = '\0';
  puVar2[0x24] = '\x01';
  puVar2[0x25] = '\0';
  puVar2[0x26] = '\0';
  puVar2[0x27] = '\0';
  puVar2[0x28] = '\0';
  puVar2[0x29] = '\0';
  puVar2[0x2a] = '\0';
  puVar2[0x2b] = '\0';
  puVar2[0x2c] = '\x03';
  puVar2[0x2d] = '\0';
  puVar2[0x2e] = '\0';
  puVar2[0x2f] = '\0';
  puVar2[0x30] = '\n';
  puVar2[0x31] = '\0';
  puVar2[0x32] = '\0';
  puVar2[0x33] = '\0';
  puVar2[0x34] = '\x04';
  puVar2[0x35] = '\0';
  puVar2[0x36] = '\0';
  puVar2[0x37] = '\0';
  puVar2[0x38] = 0xfe;
  puVar2[0x39] = 0xff;
  puVar2[0x3a] = 0xff;
  puVar2[0x3b] = 0xff;
  puVar2[0x3c] = '\x14';
  puVar2[0x3d] = '\0';
  puVar2[0x3e] = '\0';
  puVar2[0x3f] = '\0';
  puVar2[0x40] = '\0';
  puVar2[0x41] = '\0';
  puVar2[0x42] = 'H';
  puVar2[0x43] = 'B';
  puVar2[0x44] = '\0';
  puVar2[0x45] = '\0';
  puVar2[0x46] = 0xa0;
  puVar2[0x47] = '@';
  puVar2[0x48] = '\0';
  puVar2[0x49] = '\0';
  puVar2[0x4a] = '\0';
  puVar2[0x4b] = '@';
  puVar2[0x4c] = '\0';
  puVar2[0x4d] = '\0';
  puVar2[0x4e] = 0xf0;
  puVar2[0x4f] = 'A';
  puVar2[0x50] = '\0';
  puVar2[0x51] = '\0';
  puVar2[0x52] = 0x80;
  puVar2[0x53] = '@';
  puVar2[0x54] = '\0';
  puVar2[0x55] = '\0';
  puVar2[0x56] = '\0';
  puVar2[0x57] = '@';
  puVar2[0x58] = '\0';
  puVar2[0x59] = '\0';
  puVar2[0x5a] = '@';
  puVar2[0x5b] = '@';
  puVar2[0x5c] = '\0';
  puVar2[0x5d] = '\0';
  puVar2[0x5e] = 0x80;
  puVar2[0x5f] = '?';
  puVar2[0x60] = '\0';
  puVar2[0x61] = '\0';
  puVar2[0x62] = 0x80;
  puVar2[99] = '@';
  puVar2[100] = '\0';
  puVar2[0x65] = '\0';
  puVar2[0x66] = '@';
  puVar2[0x67] = '@';
  puVar2[0x68] = '\0';
  puVar2[0x69] = '\0';
  puVar2[0x6a] = '\0';
  puVar2[0x6b] = '@';
  puVar2[0x6c] = '\0';
  puVar2[0x6d] = '\0';
  puVar2[0x6e] = 0x80;
  puVar2[0x6f] = '?';
  puVar2[0x70] = '\0';
  puVar2[0x71] = '\0';
  puVar2[0x72] = '\0';
  puVar2[0x73] = '@';
  puVar2[0x74] = '\0';
  puVar2[0x75] = '\0';
  puVar2[0x76] = '\0';
  puVar2[0x77] = '@';
  puVar2[0x78] = '\0';
  puVar2[0x79] = '\0';
  puVar2[0x7a] = '\0';
  puVar2[0x7b] = '@';
  puVar2[0x7c] = '\0';
  puVar2[0x7d] = '\0';
  puVar2[0x7e] = '\0';
  puVar2[0x7f] = '@';
  puVar2[0x80] = '\0';
  puVar2[0x81] = '\0';
  puVar2[0x82] = 0x80;
  puVar2[0x83] = '@';
  puVar2[0x84] = '\0';
  puVar2[0x85] = '\0';
  puVar2[0x86] = '\0';
  puVar2[0x87] = '\0';
  puVar2[0x88] = '\0';
  puVar2[0x89] = '\0';
  puVar2[0x8a] = '\0';
  puVar2[0x8b] = '\0';
  puVar2[0x8c] = '\0';
  puVar2[0x8d] = '\0';
  puVar2[0x8e] = 0x80;
  puVar2[0x8f] = '?';
  return (char *)puVar2;
}

Assistant:

const char* GetInputOp1(std::vector<GLubyte>& in_data, std::vector<GLubyte>& out_data)
{
	/* input */
	{
		in_data.resize(16 * 9);
		int*   ip = reinterpret_cast<int*>(&in_data[0]);
		float* fp = reinterpret_cast<float*>(&in_data[0]);
		ip[0]	 = 1;
		ip[1]	 = 2;
		ip[2]	 = 3;
		ip[3]	 = 4;
		fp[4]	 = 1.0f;
		fp[5]	 = 2.0f;
		fp[6]	 = 3.0f;
		fp[7]	 = 0.0f;
		ip[8]	 = 1;
		ip[9]	 = 2;
		ip[10]	= 3;
		ip[11]	= 4;
		ip[12]	= 1;
		ip[13]	= -2;
		ip[14]	= 3;
		ip[15]	= 4;
		fp[16]	= 1.0f;
		fp[17]	= 2.0f;
		fp[18]	= 3.0f;
		fp[19]	= 4.0f;
		fp[20]	= 1.0f;
		fp[21]	= 2.0f;
		fp[22]	= 3.0f;
		fp[23]	= 4.0f;
		fp[24]	= 1.0f;
		fp[25]	= 2.0f;
		fp[26]	= 3.0f;
		fp[27]	= 4.0f;
		fp[28]	= 1.0f;
		fp[29]	= 2.0f;
		fp[30]	= 3.0f;
		fp[31]	= 4.0f;
		fp[32]	= 1.0f;
		fp[33]	= 0.0f;
		fp[34]	= 0.0f;
		fp[35]	= 4.0f;
	}
	/* expected output */
	{
		out_data.resize(16 * 9);
		int*   ip = reinterpret_cast<int*>(&out_data[0]);
		float* fp = reinterpret_cast<float*>(&out_data[0]);
		ip[0]	 = 4;
		ip[1]	 = 3;
		ip[2]	 = 2;
		ip[3]	 = 1;
		fp[4]	 = 3.0f;
		fp[5]	 = 2.0f;
		fp[6]	 = 1.0f;
		fp[7]	 = 0.0f;
		ip[8]	 = 4;
		ip[9]	 = 1;
		ip[10]	= 0;
		ip[11]	= 3;
		ip[12]	= 10;
		ip[13]	= 4;
		ip[14]	= -2;
		ip[15]	= 20;
		fp[16]	= 50.0f;
		fp[17]	= 5.0f;
		fp[18]	= 2.0f;
		fp[19]	= 30.0f;
		fp[20]	= 4.0f;
		fp[21]	= 2.0f;
		fp[22]	= 3.0f;
		fp[23]	= 1.0f;
		fp[24]	= 4.0f;
		fp[25]	= 3.0f;
		fp[26]	= 2.0f;
		fp[27]	= 1.0f;
		fp[28]	= 2.0f;
		fp[29]	= 2.0f;
		fp[30]	= 2.0f;
		fp[31]	= 2.0f;
		fp[32]	= 4.0f;
		fp[33]	= 0.0f;
		fp[34]	= 0.0f;
		fp[35]	= 1.0f;
	}
	return NL "layout(std430, binding = 0) buffer Input {" NL "  ivec4 data0;" NL "  vec3 data1;" NL "  uvec4 data2;" NL
			  "  ivec4 data3;" NL "  vec4 data4;" NL "  mat4 data5;" NL "} g_input;" NL
			  "layout(std430, binding = 1) buffer Output {" NL "  ivec4 data0;" NL "  vec3 data1;" NL
			  "  uvec4 data2;" NL "  ivec4 data3;" NL "  vec4 data4;" NL "  mat4 data5;" NL "} g_output;" NL
			  "uniform vec3 g_value0 = vec3(10, 20, 30);" NL "uniform int g_index1 = 1;" NL "void main() {" NL
			  "  int index0 = 0;" NL "  g_output.data0.wzyx = g_input.data0;" NL
			  "  g_output.data1 = g_input.data1.zyx;" NL "  g_output.data2.xwy = g_input.data2.wzx;" NL
			  "  g_output.data3.xw = ivec2(10, 20);" NL "  g_output.data3.zy = g_input.data3.yw;" NL
			  "  g_output.data4.wx = g_value0.xz;" NL "  g_output.data4.wx += g_value0.yy;" NL
			  "  g_output.data4.yz = g_input.data4.xx + g_input.data4.wx;" NL
			  "  g_output.data5[g_index1 - 1].wyzx = vec4(1, 2, 3, 4);" NL
			  "  g_output.data5[g_index1 + index0] = g_input.data5[g_index1].wzyx;" NL
			  "  g_output.data5[1 + g_index1] = g_input.data5[g_index1 + 1].yyyy;" NL
			  "  g_output.data5[5 - g_index1 - 1].wx = g_input.data5[4 - g_index1].xw;" NL "}";
}